

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O2

void __thiscall
fmt::internal::PrintfArgFormatter<wchar_t>::visit_char(PrintfArgFormatter<wchar_t> *this,int value)

{
  BasicWriter<wchar_t> *this_00;
  FormatSpec *pFVar1;
  CharPtr pwVar2;
  ulong n;
  wchar_t fill;
  WidthSpec local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  this_00 = (this->super_ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t>).
            writer_;
  pFVar1 = (this->super_ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t>).spec_
  ;
  if ((pFVar1->type_ != '\0') && (pFVar1->type_ != 'c')) {
    local_28._0_4_ = pFVar1->precision_;
    local_28._4_1_ = pFVar1->type_;
    local_28._5_3_ = *(undefined3 *)&pFVar1->field_0x15;
    local_38 = (pFVar1->super_AlignSpec).super_WidthSpec;
    uStack_30 = *(undefined8 *)&(pFVar1->super_AlignSpec).align_;
    BasicWriter<wchar_t>::write_int<int,fmt::FormatSpec>(this_00,value,*pFVar1);
  }
  n = (ulong)(pFVar1->super_AlignSpec).super_WidthSpec.width_;
  if (n < 2) {
    pwVar2 = BasicWriter<wchar_t>::grow_buffer(this_00,1);
  }
  else {
    fill = L' ';
    pwVar2 = BasicWriter<wchar_t>::grow_buffer(this_00,n);
    if ((pFVar1->super_AlignSpec).align_ == ALIGN_LEFT) {
      std::__fill_n_a<wchar_t*,unsigned_int,wchar_t>
                (pwVar2 + 1,(pFVar1->super_AlignSpec).super_WidthSpec.width_ - 1,&fill);
    }
    else {
      std::__fill_n_a<wchar_t*,unsigned_int,wchar_t>
                (pwVar2,(pFVar1->super_AlignSpec).super_WidthSpec.width_ - 1,&fill);
      pwVar2 = pwVar2 + ((pFVar1->super_AlignSpec).super_WidthSpec.width_ - 1);
    }
  }
  *pwVar2 = value;
  return;
}

Assistant:

void visit_char(int value) {
    const FormatSpec &fmt_spec = this->spec();
    BasicWriter<Char> &w = this->writer();
    if (fmt_spec.type_ && fmt_spec.type_ != 'c')
      w.write_int(value, fmt_spec);
    typedef typename BasicWriter<Char>::CharPtr CharPtr;
    CharPtr out = CharPtr();
    if (fmt_spec.width_ > 1) {
      Char fill = ' ';
      out = w.grow_buffer(fmt_spec.width_);
      if (fmt_spec.align_ != ALIGN_LEFT) {
        std::fill_n(out, fmt_spec.width_ - 1, fill);
        out += fmt_spec.width_ - 1;
      } else {
        std::fill_n(out + 1, fmt_spec.width_ - 1, fill);
      }
    } else {
      out = w.grow_buffer(1);
    }
    *out = static_cast<Char>(value);
  }